

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
               (DecimalCastData<short> *state,int32_t exponent)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar6 = 0;
  uVar3 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar3 = uVar6;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar6 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar3 - exponent == 0 || (int)uVar3 < exponent) {
      uVar6 = exponent - uVar3;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar3 - exponent);
    }
  }
  bVar1 = Finalize<duckdb::DecimalCastData<short>,false>(state);
  if (bVar1) {
    bVar1 = uVar6 == 0;
    if ((int)uVar6 < 0) {
      lVar5 = (long)(int)uVar6;
      uVar3 = (uint)(ushort)state->result;
      do {
        lVar5 = lVar5 + 1;
        sVar2 = (short)uVar3;
        uVar3 = (int)sVar2 / 10;
        if ((int)sVar2 + 9U < 0x13) break;
      } while (lVar5 != 0);
      state->result = (StoreType)uVar3;
      bVar1 = true;
      if (4 < (int)((int)sVar2 + uVar3 * -10)) {
        state->result = state->result + 1;
      }
    }
    else if (!bVar1) {
      bVar4 = state->digit_count;
      sVar2 = state->result;
      uVar7 = 1;
      do {
        if (sVar2 != 0) {
          if ((uint)state->width - (uint)state->scale == (uint)bVar4) {
            return bVar1;
          }
          bVar4 = bVar4 + 1;
          state->digit_count = bVar4;
          if (0xccc < sVar2) {
            return bVar1;
          }
          sVar2 = sVar2 * 10;
          state->result = sVar2;
        }
        bVar1 = uVar6 <= uVar7;
        bVar8 = uVar7 != uVar6;
        uVar7 = uVar7 + 1;
      } while (bVar8);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}